

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseInstrList(WastParser *this,ExprList *exprs)

{
  size_t this_00;
  bool bVar1;
  Result RVar2;
  TokenTypePair pair;
  __off64_t *in_R8;
  size_t in_R9;
  iterator iVar3;
  uint in_stack_ffffffffffffff88;
  Expr *local_50;
  undefined1 local_38 [8];
  ExprList new_exprs;
  ExprList *exprs_local;
  WastParser *this_local;
  
  new_exprs.size_ = (size_t)exprs;
  intrusive_list<wabt::Expr>::intrusive_list((intrusive_list<wabt::Expr> *)local_38);
  do {
    while( true ) {
      pair = PeekPair(this);
      bVar1 = anon_unknown_1::IsInstr(pair);
      if (!bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Ok);
        goto LAB_002aa8d5;
      }
      RVar2 = ParseInstr(this,(ExprList *)local_38);
      bVar1 = Succeeded(RVar2);
      this_00 = new_exprs.size_;
      if (!bVar1) break;
      iVar3 = intrusive_list<wabt::Expr>::end((intrusive_list<wabt::Expr> *)new_exprs.size_);
      local_50 = iVar3.node_;
      intrusive_list<wabt::Expr>::splice
                ((intrusive_list<wabt::Expr> *)this_00,(int)iVar3.list_,(__off64_t *)local_50,
                 (int)local_38,in_R8,in_R9,in_stack_ffffffffffffff88);
    }
    RVar2 = Synchronize(this,anon_unknown_1::IsInstr);
    bVar1 = Failed(RVar2);
  } while (!bVar1);
  Result::Result((Result *)((long)&this_local + 4),Error);
LAB_002aa8d5:
  intrusive_list<wabt::Expr>::~intrusive_list((intrusive_list<wabt::Expr> *)local_38);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseInstrList(ExprList* exprs) {
  WABT_TRACE(ParseInstrList);
  ExprList new_exprs;
  while (IsInstr(PeekPair())) {
    if (Succeeded(ParseInstr(&new_exprs))) {
      exprs->splice(exprs->end(), new_exprs);
    } else {
      CHECK_RESULT(Synchronize(IsInstr));
    }
  }
  return Result::Ok;
}